

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

bool __thiscall cmGraphVizWriter::ItemExcluded(cmGraphVizWriter *this,cmLinkItem *item)

{
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  string *psVar4;
  string_view str;
  string_view str_00;
  string_view str_01;
  string itemName;
  string local_40;
  
  psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
  std::__cxx11::string::string((string *)&local_40,(string *)psVar4);
  bVar1 = ItemNameFilteredOut(this,&local_40);
  bVar2 = 1;
  if (bVar1) goto LAB_0037ebdf;
  if (item->Target == (cmGeneratorTarget *)0x0) {
    bVar2 = this->GenerateForExternals;
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(item->Target);
    if (TVar3 == UTILITY) {
      str._M_str = local_40._M_dataplus._M_p;
      str._M_len = local_40._M_string_length;
      bVar1 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])"Nightly");
      if (bVar1) goto LAB_0037ebdf;
      str_00._M_str = local_40._M_dataplus._M_p;
      str_00._M_len = local_40._M_string_length;
      bVar1 = cmHasLiteralPrefix<11ul>(str_00,(char (*) [11])"Continuous");
      if (bVar1) goto LAB_0037ebdf;
      str_01._M_str = local_40._M_dataplus._M_p;
      str_01._M_len = local_40._M_string_length;
      bVar1 = cmHasLiteralPrefix<13ul>(str_01,(char (*) [13])"Experimental");
      if (bVar1) goto LAB_0037ebdf;
    }
    bVar1 = cmGeneratorTarget::IsImported(item->Target);
    if ((bVar1) && (this->GenerateForExternals != true)) goto LAB_0037ebdf;
    TVar3 = cmGeneratorTarget::GetType(item->Target);
    bVar2 = TargetTypeEnabled(this,TVar3);
  }
  bVar2 = bVar2 ^ 1;
LAB_0037ebdf:
  std::__cxx11::string::~string((string *)&local_40);
  return (bool)bVar2;
}

Assistant:

bool cmGraphVizWriter::ItemExcluded(cmLinkItem const& item)
{
  auto const itemName = item.AsStr();

  if (this->ItemNameFilteredOut(itemName)) {
    return true;
  }

  if (item.Target == nullptr) {
    return !this->GenerateForExternals;
  }

  if (item.Target->GetType() == cmStateEnums::UTILITY) {
    if (cmHasLiteralPrefix(itemName, "Nightly") ||
        cmHasLiteralPrefix(itemName, "Continuous") ||
        cmHasLiteralPrefix(itemName, "Experimental")) {
      return true;
    }
  }

  if (item.Target->IsImported() && !this->GenerateForExternals) {
    return true;
  }

  return !this->TargetTypeEnabled(item.Target->GetType());
}